

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

size_t M_GetRowDim(Matrix *M)

{
  LASErrIdType LVar1;
  size_t local_18;
  size_t Dim;
  Matrix *M_local;
  
  LVar1 = LASResult();
  if (LVar1 == LASOK) {
    local_18 = M->RowDim;
  }
  else {
    local_18 = 0;
  }
  return local_18;
}

Assistant:

size_t M_GetRowDim(Matrix *M)
/* returns the row dimension of the matrix M */
{
    size_t Dim;

    if (LASResult() == LASOK)
        Dim = M->RowDim;
    else
        Dim = 0;
    return(Dim);
}